

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue-C-API.cpp
# Opt level: O1

llb_build_value_file_info_t * llbuild::capi::convertFileInfo(FileInfo *fileInfo)

{
  llb_build_value_file_info_t *in_RDI;
  
  in_RDI->device = fileInfo->device;
  in_RDI->inode = fileInfo->inode;
  in_RDI->mode = fileInfo->mode;
  in_RDI->size = fileInfo->size;
  (in_RDI->modTime).seconds = (fileInfo->modTime).seconds;
  (in_RDI->modTime).nanoseconds = (fileInfo->modTime).nanoseconds;
  return in_RDI;
}

Assistant:

const llb_build_value_file_info_t llbuild::capi::convertFileInfo(const basic::FileInfo &fileInfo) {
  return llb_build_value_file_info_t {
    fileInfo.device,
    fileInfo.inode,
    fileInfo.mode,
    fileInfo.size,
    llb_build_value_file_timestamp_t {
      fileInfo.modTime.seconds,
      fileInfo.modTime.nanoseconds,
    },
  };
}